

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.hpp
# Opt level: O0

void __thiscall OpenMD::PrepareVisitor::~PrepareVisitor(PrepareVisitor *this)

{
  void *in_RDI;
  
  ~PrepareVisitor((PrepareVisitor *)0x34fbe8);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

PrepareVisitor() : BaseVisitor() { visitorName = "prepareVisitor"; }